

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Runtime::~Runtime(Runtime *this)

{
  _Atomic_word *p_Var1;
  _Rb_tree_header *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  CollectionPtr c;
  long local_40;
  undefined8 local_38;
  
  p_Var6 = (this->m_propertyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->m_propertyMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var2) {
    do {
      if (*(int *)&p_Var6[1]._M_parent == 5) {
        Variant::GetCollection((Variant *)&local_40);
        p_Var7 = (_Rb_tree_node_base *)(local_40 + 8);
        for (p_Var5 = *(_Rb_tree_node_base **)(local_40 + 0x18); p_Var5 != p_Var7;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          Variant::SetNull((Variant *)&p_Var5[2]._M_parent);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var2);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_4096UL,_16UL>_>
  ::~_Rb_tree(&(this->m_symbolTypeMap)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Jinx::Variant>,_std::_Select1st<std::pair<const_unsigned_long,_Jinx::Variant>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_Jinx::Variant>,_4096UL,_16UL>_>
  ::~_Rb_tree(&(this->m_propertyMap)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_4096UL,_16UL>_>
  ::~_Rb_tree(&(this->m_functionMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>_>
  ::~_Rb_tree(&(this->m_libraryMap)._M_t);
  (this->m_staticArena).m_ptr = (char *)0x0;
  p_Var3 = (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
           super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

inline_t Runtime::~Runtime()
	{
		// Clear potential circular references by explicitly destroying collection values
		for (auto & s : m_propertyMap)
		{
			if (s.second.IsCollection())
			{
				auto c = s.second.GetCollection();
				for (auto & e : *c)
				{
					e.second.SetNull();
				}
			}
		}
	}